

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int on_ack_stop_sending(quicly_sentmap_t *map,quicly_sent_packet_t *packet,int acked,
                       quicly_sent_t *sent)

{
  quicly_stream_t *pqVar1;
  int in_EDX;
  long in_RDI;
  quicly_stream_t *stream;
  quicly_conn_t *conn;
  quicly_stream_id_t in_stack_ffffffffffffffd0;
  
  pqVar1 = quicly_get_stream((quicly_conn_t *)(in_RDI + -0x630),in_stack_ffffffffffffffd0);
  if ((pqVar1 != (quicly_stream_t *)0x0) &&
     (on_ack_stream_state_sender(&(pqVar1->_send_aux).stop_sending.sender_state,in_EDX),
     (pqVar1->_send_aux).stop_sending.sender_state != QUICLY_SENDER_STATE_ACKED)) {
    sched_stream_control((quicly_stream_t *)0x1548f6);
  }
  return 0;
}

Assistant:

static int on_ack_stop_sending(quicly_sentmap_t *map, const quicly_sent_packet_t *packet, int acked, quicly_sent_t *sent)
{
    quicly_conn_t *conn = (quicly_conn_t *)((char *)map - offsetof(quicly_conn_t, egress.loss.sentmap));
    quicly_stream_t *stream;

    if ((stream = quicly_get_stream(conn, sent->data.stream_state_sender.stream_id)) != NULL) {
        on_ack_stream_state_sender(&stream->_send_aux.stop_sending.sender_state, acked);
        if (stream->_send_aux.stop_sending.sender_state != QUICLY_SENDER_STATE_ACKED)
            sched_stream_control(stream);
    }

    return 0;
}